

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::IsWindowAbove(ImGuiWindow *potential_above,ImGuiWindow *potential_below)

{
  ImGuiWindow *pIVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar2 = (uint)potential_above->Flags >> 0x19 & 1;
  uVar3 = (uint)potential_below->Flags >> 0x19 & 1;
  if (uVar2 != uVar3) {
    return uVar3 < uVar2;
  }
  uVar4 = (ulong)(uint)(GImGui->Windows).Size;
  while( true ) {
    if ((int)uVar4 < 1) {
      return false;
    }
    pIVar1 = (GImGui->Windows).Data[uVar4 - 1];
    if (pIVar1 == potential_above) break;
    uVar4 = uVar4 - 1;
    if (pIVar1 == potential_below) {
      return false;
    }
  }
  return true;
}

Assistant:

bool ImGui::IsWindowAbove(ImGuiWindow* potential_above, ImGuiWindow* potential_below)
{
    ImGuiContext& g = *GImGui;

    // It would be saner to ensure that display layer is always reflected in the g.Windows[] order, which would likely requires altering all manipulations of that array
    const int display_layer_delta = GetWindowDisplayLayer(potential_above) - GetWindowDisplayLayer(potential_below);
    if (display_layer_delta != 0)
        return display_layer_delta > 0;

    for (int i = g.Windows.Size - 1; i >= 0; i--)
    {
        ImGuiWindow* candidate_window = g.Windows[i];
        if (candidate_window == potential_above)
            return true;
        if (candidate_window == potential_below)
            return false;
    }
    return false;
}